

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spectrum.c
# Opt level: O0

void zxbox_union(zxbox_t *a,zxbox_t *b,zxbox_t *c)

{
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  zxbox_t *c_local;
  zxbox_t *b_local;
  zxbox_t *a_local;
  
  if (a->x0 < b->x0) {
    local_1c = a->x0;
  }
  else {
    local_1c = b->x0;
  }
  c->x0 = local_1c;
  if (a->y0 < b->y0) {
    local_20 = a->y0;
  }
  else {
    local_20 = b->y0;
  }
  c->y0 = local_20;
  if (b->x1 < a->x1) {
    local_24 = a->x1;
  }
  else {
    local_24 = b->x1;
  }
  c->x1 = local_24;
  if (b->y1 < a->y1) {
    local_28 = a->y1;
  }
  else {
    local_28 = b->y1;
  }
  c->y1 = local_28;
  return;
}

Assistant:

static void zxbox_union(const zxbox_t *a, const zxbox_t *b, zxbox_t *c)
{
  c->x0 = MIN(a->x0, b->x0);
  c->y0 = MIN(a->y0, b->y0);
  c->x1 = MAX(a->x1, b->x1);
  c->y1 = MAX(a->y1, b->y1);
}